

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall
ImVector<ImGuiListClipperRange>::push_back
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  int *piVar1;
  ImGuiListClipperRange *pIVar2;
  ImS8 IVar3;
  ImS8 IVar4;
  undefined1 uVar5;
  int iVar6;
  ImGuiListClipperRange *pIVar7;
  int iVar8;
  int iVar9;
  
  iVar6 = this->Size;
  if (iVar6 == this->Capacity) {
    if (iVar6 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar6 / 2 + iVar6;
    }
    iVar9 = iVar6 + 1;
    if (iVar6 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar7 = (ImGuiListClipperRange *)
             (*GImAllocatorAllocFunc)((long)iVar9 * 0xc,GImAllocatorUserData);
    if (this->Data != (ImGuiListClipperRange *)0x0) {
      memcpy(pIVar7,this->Data,(long)this->Size * 0xc);
      pIVar2 = this->Data;
      if ((pIVar2 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    this->Data = pIVar7;
    this->Capacity = iVar9;
    iVar6 = this->Size;
  }
  pIVar7 = this->Data;
  IVar3 = v->PosToIndexOffsetMin;
  IVar4 = v->PosToIndexOffsetMax;
  uVar5 = v->field_0xb;
  pIVar2 = pIVar7 + iVar6;
  pIVar2->PosToIndexConvert = v->PosToIndexConvert;
  pIVar2->PosToIndexOffsetMin = IVar3;
  pIVar2->PosToIndexOffsetMax = IVar4;
  pIVar2->field_0xb = uVar5;
  iVar8 = v->Max;
  pIVar7 = pIVar7 + iVar6;
  pIVar7->Min = v->Min;
  pIVar7->Max = iVar8;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }